

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::BVHNIntersector1<4,_16781328,_true,_embree::sse2::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  undefined1 auVar15 [16];
  char cVar16;
  AABBNodeMB4D *node1;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  NodeRef *pNVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined4 uVar28;
  ulong unaff_R15;
  undefined4 uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar57;
  float fVar58;
  vfloat4 a0;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar59;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint uVar60;
  uint uVar63;
  uint uVar64;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar75;
  undefined1 auVar69 [16];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar83;
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  vfloat4 a;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  Precalculations pre;
  NodeRef stack [244];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar5 = ray->tfar, 0.0 <= fVar5)) {
    aVar6 = (ray->dir).field_0.field_1;
    fVar66 = aVar6.x;
    fVar70 = aVar6.y;
    fVar72 = aVar6.z;
    aVar75 = aVar6.field_3;
    fVar35 = fVar70 * fVar70;
    fVar36 = fVar72 * fVar72;
    fVar37 = aVar75.w * aVar75.w;
    fVar49 = fVar35 + fVar66 * fVar66 + fVar36;
    auVar61._0_8_ = CONCAT44(fVar35 + fVar35 + fVar37,fVar49);
    auVar61._8_4_ = fVar35 + fVar36 + fVar36;
    auVar61._12_4_ = fVar35 + fVar37 + fVar37;
    auVar52._8_4_ = auVar61._8_4_;
    auVar52._0_8_ = auVar61._0_8_;
    auVar52._12_4_ = auVar61._12_4_;
    auVar61 = rsqrtss(auVar52,auVar61);
    fVar35 = auVar61._0_4_;
    pre.depth_scale = fVar35 * 1.5 - fVar35 * fVar35 * fVar49 * 0.5 * fVar35;
    fVar35 = fVar66 * pre.depth_scale;
    fVar36 = fVar70 * pre.depth_scale;
    fVar37 = fVar72 * pre.depth_scale;
    fVar83 = -fVar36;
    fVar49 = -fVar37;
    auVar76._8_4_ = 0xffffffff;
    auVar76._0_8_ = 0xffffffffffffffff;
    if (fVar83 * fVar83 + fVar37 * fVar37 + 0.0 <= fVar35 * fVar35 + fVar49 * fVar49 + 0.0) {
      auVar76 = SUB1612((undefined1  [16])0x0,0);
    }
    auVar14._4_4_ = (uint)fVar83 & auVar76._8_4_;
    auVar14._0_4_ = (uint)fVar37 & auVar76._4_4_;
    auVar14._8_4_ = 0;
    auVar77._0_4_ = ~auVar76._0_4_ & (uint)fVar49;
    auVar77._4_4_ = 0;
    auVar77._8_4_ = ~auVar76._8_4_ & (uint)fVar35;
    auVar77 = auVar77 | auVar14 << 0x20;
    fVar83 = auVar77._0_4_;
    fVar71 = auVar77._4_4_;
    fVar74 = auVar77._8_4_;
    fVar49 = fVar71 * fVar71;
    fVar73 = fVar74 * fVar74;
    fVar84 = fVar49 + fVar83 * fVar83 + fVar73;
    auVar86._0_8_ = CONCAT44(fVar49 + fVar49 + 0.0,fVar84);
    auVar86._8_4_ = fVar49 + fVar73 + fVar73;
    auVar86._12_4_ = fVar49 + 0.0 + 0.0;
    auVar87._8_4_ = auVar86._8_4_;
    auVar87._0_8_ = auVar86._0_8_;
    auVar87._12_4_ = auVar86._12_4_;
    auVar61 = rsqrtss(auVar87,auVar86);
    fVar49 = auVar61._0_4_;
    fVar49 = fVar49 * 1.5 - fVar49 * fVar49 * fVar84 * 0.5 * fVar49;
    fVar83 = fVar49 * fVar83;
    fVar71 = fVar49 * fVar71;
    fVar74 = fVar49 * fVar74;
    fVar73 = fVar71 * fVar35 - fVar36 * fVar83;
    fVar84 = fVar74 * fVar36 - fVar37 * fVar71;
    fVar80 = fVar83 * fVar37 - fVar35 * fVar74;
    fVar82 = fVar49 * 0.0 * aVar75.w * pre.depth_scale - aVar75.w * pre.depth_scale * fVar49 * 0.0;
    fVar49 = fVar84 * fVar84;
    fVar81 = fVar80 * fVar80;
    fVar82 = fVar82 * fVar82;
    fVar90 = fVar81 + fVar49 + fVar73 * fVar73;
    fVar91 = fVar82 + fVar49 + fVar49;
    fVar81 = fVar81 + fVar49 + fVar81;
    fVar82 = fVar82 + fVar49 + fVar82;
    auVar79._4_4_ = fVar91;
    auVar79._0_4_ = fVar90;
    auVar79._8_4_ = fVar81;
    auVar79._12_4_ = fVar82;
    auVar54._4_4_ = fVar91;
    auVar54._0_4_ = fVar90;
    auVar54._8_4_ = fVar81;
    auVar54._12_4_ = fVar82;
    auVar61 = rsqrtss(auVar79,auVar54);
    fVar49 = auVar61._0_4_;
    fVar49 = fVar49 * 1.5 - fVar49 * fVar49 * fVar90 * 0.5 * fVar49;
    pre.ray_space.vz.field_0.m128[1] = fVar49 * fVar73;
    pre.ray_space.vz.field_0.m128[0] = fVar74;
    pre.ray_space.vz.field_0.m128[2] = pre.depth_scale * fVar37;
    pre.ray_space.vz.field_0.m128[3] = 0.0;
    pre.ray_space.vx.field_0.m128[1] = fVar49 * fVar84;
    pre.ray_space.vx.field_0.m128[0] = fVar83;
    pre.ray_space.vx.field_0.m128[2] = pre.depth_scale * fVar35;
    pre.ray_space.vx.field_0.m128[3] = 0.0;
    pre.ray_space.vy.field_0.m128[1] = fVar49 * fVar80;
    pre.ray_space.vy.field_0.m128[0] = fVar71;
    pre.ray_space.vy.field_0.m128[2] = pre.depth_scale * fVar36;
    pre.ray_space.vy.field_0.m128[3] = 0.0;
    pNVar24 = stack + 1;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar37 = (ray->org).field_0.m128[0];
    fVar49 = (ray->org).field_0.m128[1];
    fVar83 = (ray->org).field_0.m128[2];
    fVar35 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar36 = 0.0;
    if (0.0 <= fVar35) {
      fVar36 = fVar35;
    }
    auVar61 = divps(_DAT_01feca10,(undefined1  [16])aVar6);
    fVar35 = (float)(~-(uint)(1e-18 <= ABS(fVar66)) & 0x5d5e0b6b |
                    auVar61._0_4_ & -(uint)(1e-18 <= ABS(fVar66)));
    fVar71 = (float)(~-(uint)(1e-18 <= ABS(fVar70)) & 0x5d5e0b6b |
                    auVar61._4_4_ & -(uint)(1e-18 <= ABS(fVar70)));
    fVar73 = (float)(~-(uint)(1e-18 <= ABS(fVar72)) & 0x5d5e0b6b |
                    auVar61._8_4_ & -(uint)(1e-18 <= ABS(fVar72)));
    fVar74 = fVar35 * 0.99999964;
    fVar84 = fVar71 * 0.99999964;
    fVar80 = fVar73 * 0.99999964;
    fVar35 = fVar35 * 1.0000004;
    fVar71 = fVar71 * 1.0000004;
    fVar73 = fVar73 * 1.0000004;
    uVar25 = (ulong)(fVar74 < 0.0) * 0x10;
    uVar26 = (ulong)(fVar84 < 0.0) << 4 | 0x20;
    uVar27 = (ulong)(fVar80 < 0.0) << 4 | 0x40;
    auVar88._4_4_ = fVar36;
    auVar88._0_4_ = fVar36;
    auVar88._8_4_ = fVar36;
    auVar88._12_4_ = fVar36;
    do {
      if (pNVar24 == stack) {
        return;
      }
      uVar19 = pNVar24[-1].ptr;
      pNVar24 = pNVar24 + -1;
      do {
        if ((uVar19 & 8) == 0) {
          fVar36 = (ray->dir).field_0.m128[3];
          uVar20 = (uint)uVar19 & 7;
          uVar17 = uVar19 & 0xfffffffffffffff0;
          uVar29 = (undefined4)(unaff_R15 >> 0x20);
          if (uVar20 == 3) {
            fVar67 = 1.0 - fVar36;
            fVar68 = fVar67 * 0.0;
            fVar81 = fVar66 * *(float *)(uVar17 + 0x20) +
                     fVar70 * *(float *)(uVar17 + 0x50) + fVar72 * *(float *)(uVar17 + 0x80);
            fVar82 = fVar66 * *(float *)(uVar17 + 0x24) +
                     fVar70 * *(float *)(uVar17 + 0x54) + fVar72 * *(float *)(uVar17 + 0x84);
            fVar90 = fVar66 * *(float *)(uVar17 + 0x28) +
                     fVar70 * *(float *)(uVar17 + 0x58) + fVar72 * *(float *)(uVar17 + 0x88);
            fVar91 = fVar66 * *(float *)(uVar17 + 0x2c) +
                     fVar70 * *(float *)(uVar17 + 0x5c) + fVar72 * *(float *)(uVar17 + 0x8c);
            fVar50 = fVar66 * *(float *)(uVar17 + 0x30) +
                     fVar70 * *(float *)(uVar17 + 0x60) + fVar72 * *(float *)(uVar17 + 0x90);
            fVar57 = fVar66 * *(float *)(uVar17 + 0x34) +
                     fVar70 * *(float *)(uVar17 + 100) + fVar72 * *(float *)(uVar17 + 0x94);
            fVar58 = fVar66 * *(float *)(uVar17 + 0x38) +
                     fVar70 * *(float *)(uVar17 + 0x68) + fVar72 * *(float *)(uVar17 + 0x98);
            fVar59 = fVar66 * *(float *)(uVar17 + 0x3c) +
                     fVar70 * *(float *)(uVar17 + 0x6c) + fVar72 * *(float *)(uVar17 + 0x9c);
            fVar104 = fVar66 * *(float *)(uVar17 + 0x40) +
                      fVar70 * *(float *)(uVar17 + 0x70) + fVar72 * *(float *)(uVar17 + 0xa0);
            fVar105 = fVar66 * *(float *)(uVar17 + 0x44) +
                      fVar70 * *(float *)(uVar17 + 0x74) + fVar72 * *(float *)(uVar17 + 0xa4);
            fVar106 = fVar66 * *(float *)(uVar17 + 0x48) +
                      fVar70 * *(float *)(uVar17 + 0x78) + fVar72 * *(float *)(uVar17 + 0xa8);
            fVar107 = fVar66 * *(float *)(uVar17 + 0x4c) +
                      fVar70 * *(float *)(uVar17 + 0x7c) + fVar72 * *(float *)(uVar17 + 0xac);
            uVar60 = (uint)DAT_01fec6c0;
            uVar63 = DAT_01fec6c0._4_4_;
            uVar64 = DAT_01fec6c0._8_4_;
            uVar65 = DAT_01fec6c0._12_4_;
            uVar20 = -(uint)(1e-18 <= (float)((uint)fVar81 & uVar60));
            uVar30 = -(uint)(1e-18 <= (float)((uint)fVar82 & uVar63));
            uVar31 = -(uint)(1e-18 <= (float)((uint)fVar90 & uVar64));
            uVar32 = -(uint)(1e-18 <= (float)((uint)fVar91 & uVar65));
            auVar40._0_4_ = (uint)fVar81 & uVar20;
            auVar40._4_4_ = (uint)fVar82 & uVar30;
            auVar40._8_4_ = (uint)fVar90 & uVar31;
            auVar40._12_4_ = (uint)fVar91 & uVar32;
            auVar46._0_8_ = CONCAT44(~uVar30,~uVar20) & 0x219392ef219392ef;
            auVar46._8_4_ = ~uVar31 & 0x219392ef;
            auVar46._12_4_ = ~uVar32 & 0x219392ef;
            auVar46 = auVar46 | auVar40;
            uVar20 = -(uint)(1e-18 <= (float)((uint)fVar50 & uVar60));
            uVar30 = -(uint)(1e-18 <= (float)((uint)fVar57 & uVar63));
            uVar31 = -(uint)(1e-18 <= (float)((uint)fVar58 & uVar64));
            uVar32 = -(uint)(1e-18 <= (float)((uint)fVar59 & uVar65));
            auVar55._0_4_ = (uint)fVar50 & uVar20;
            auVar55._4_4_ = (uint)fVar57 & uVar30;
            auVar55._8_4_ = (uint)fVar58 & uVar31;
            auVar55._12_4_ = (uint)fVar59 & uVar32;
            auVar41._0_8_ = CONCAT44(~uVar30,~uVar20) & 0x219392ef219392ef;
            auVar41._8_4_ = ~uVar31 & 0x219392ef;
            auVar41._12_4_ = ~uVar32 & 0x219392ef;
            auVar41 = auVar41 | auVar55;
            uVar20 = -(uint)(1e-18 <= (float)((uint)fVar104 & uVar60));
            uVar30 = -(uint)(1e-18 <= (float)((uint)fVar105 & uVar63));
            uVar31 = -(uint)(1e-18 <= (float)((uint)fVar106 & uVar64));
            uVar32 = -(uint)(1e-18 <= (float)((uint)fVar107 & uVar65));
            auVar56._0_8_ = CONCAT44(~uVar30,~uVar20) & 0x219392ef219392ef;
            auVar56._8_4_ = ~uVar31 & 0x219392ef;
            auVar56._12_4_ = ~uVar32 & 0x219392ef;
            auVar13._4_4_ = (uint)fVar105 & uVar30;
            auVar13._0_4_ = (uint)fVar104 & uVar20;
            auVar13._8_4_ = (uint)fVar106 & uVar31;
            auVar13._12_4_ = (uint)fVar107 & uVar32;
            auVar56 = auVar56 | auVar13;
            auVar61 = rcpps(_DAT_01fec6c0,auVar46);
            fVar104 = auVar61._0_4_;
            fVar105 = auVar61._4_4_;
            fVar106 = auVar61._8_4_;
            fVar107 = auVar61._12_4_;
            fVar104 = (1.0 - auVar46._0_4_ * fVar104) * fVar104 + fVar104;
            fVar105 = (1.0 - auVar46._4_4_ * fVar105) * fVar105 + fVar105;
            fVar106 = (1.0 - auVar46._8_4_ * fVar106) * fVar106 + fVar106;
            fVar107 = (1.0 - auVar46._12_4_ * fVar107) * fVar107 + fVar107;
            auVar61 = rcpps(auVar61,auVar41);
            fVar50 = auVar61._0_4_;
            fVar57 = auVar61._4_4_;
            fVar58 = auVar61._8_4_;
            fVar59 = auVar61._12_4_;
            fVar50 = (1.0 - auVar41._0_4_ * fVar50) * fVar50 + fVar50;
            fVar57 = (1.0 - auVar41._4_4_ * fVar57) * fVar57 + fVar57;
            fVar58 = (1.0 - auVar41._8_4_ * fVar58) * fVar58 + fVar58;
            fVar59 = (1.0 - auVar41._12_4_ * fVar59) * fVar59 + fVar59;
            auVar61 = rcpps(auVar61,auVar56);
            fVar81 = auVar61._0_4_;
            fVar82 = auVar61._4_4_;
            fVar90 = auVar61._8_4_;
            fVar91 = auVar61._12_4_;
            fVar81 = (1.0 - auVar56._0_4_ * fVar81) * fVar81 + fVar81;
            fVar82 = (1.0 - auVar56._4_4_ * fVar82) * fVar82 + fVar82;
            fVar90 = (1.0 - auVar56._8_4_ * fVar90) * fVar90 + fVar90;
            fVar91 = (1.0 - auVar56._12_4_ * fVar91) * fVar91 + fVar91;
            auVar15._4_4_ = fVar5;
            auVar15._0_4_ = fVar5;
            auVar15._8_4_ = fVar5;
            auVar15._12_4_ = fVar5;
            fVar92 = *(float *)(uVar17 + 0x20) * fVar37 +
                     *(float *)(uVar17 + 0x50) * fVar49 +
                     *(float *)(uVar17 + 0x80) * fVar83 + *(float *)(uVar17 + 0xb0);
            fVar93 = *(float *)(uVar17 + 0x24) * fVar37 +
                     *(float *)(uVar17 + 0x54) * fVar49 +
                     *(float *)(uVar17 + 0x84) * fVar83 + *(float *)(uVar17 + 0xb4);
            fVar94 = *(float *)(uVar17 + 0x28) * fVar37 +
                     *(float *)(uVar17 + 0x58) * fVar49 +
                     *(float *)(uVar17 + 0x88) * fVar83 + *(float *)(uVar17 + 0xb8);
            fVar95 = *(float *)(uVar17 + 0x2c) * fVar37 +
                     *(float *)(uVar17 + 0x5c) * fVar49 +
                     *(float *)(uVar17 + 0x8c) * fVar83 + *(float *)(uVar17 + 0xbc);
            fVar96 = *(float *)(uVar17 + 0x30) * fVar37 +
                     *(float *)(uVar17 + 0x60) * fVar49 +
                     *(float *)(uVar17 + 0x90) * fVar83 + *(float *)(uVar17 + 0xc0);
            fVar97 = *(float *)(uVar17 + 0x34) * fVar37 +
                     *(float *)(uVar17 + 100) * fVar49 +
                     *(float *)(uVar17 + 0x94) * fVar83 + *(float *)(uVar17 + 0xc4);
            fVar98 = *(float *)(uVar17 + 0x38) * fVar37 +
                     *(float *)(uVar17 + 0x68) * fVar49 +
                     *(float *)(uVar17 + 0x98) * fVar83 + *(float *)(uVar17 + 200);
            fVar99 = *(float *)(uVar17 + 0x3c) * fVar37 +
                     *(float *)(uVar17 + 0x6c) * fVar49 +
                     *(float *)(uVar17 + 0x9c) * fVar83 + *(float *)(uVar17 + 0xcc);
            fVar100 = *(float *)(uVar17 + 0x40) * fVar37 +
                      *(float *)(uVar17 + 0x70) * fVar49 +
                      *(float *)(uVar17 + 0xa0) * fVar83 + *(float *)(uVar17 + 0xd0);
            fVar101 = *(float *)(uVar17 + 0x44) * fVar37 +
                      *(float *)(uVar17 + 0x74) * fVar49 +
                      *(float *)(uVar17 + 0xa4) * fVar83 + *(float *)(uVar17 + 0xd4);
            fVar102 = *(float *)(uVar17 + 0x48) * fVar37 +
                      *(float *)(uVar17 + 0x78) * fVar49 +
                      *(float *)(uVar17 + 0xa8) * fVar83 + *(float *)(uVar17 + 0xd8);
            fVar103 = *(float *)(uVar17 + 0x4c) * fVar37 +
                      *(float *)(uVar17 + 0x7c) * fVar49 +
                      *(float *)(uVar17 + 0xac) * fVar83 + *(float *)(uVar17 + 0xdc);
            auVar85._0_8_ =
                 CONCAT44(((*(float *)(uVar17 + 0xe4) * fVar36 + fVar68) - fVar93) * fVar105,
                          ((*(float *)(uVar17 + 0xe0) * fVar36 + fVar68) - fVar92) * fVar104);
            auVar85._8_4_ = ((*(float *)(uVar17 + 0xe8) * fVar36 + fVar68) - fVar94) * fVar106;
            auVar85._12_4_ = ((*(float *)(uVar17 + 0xec) * fVar36 + fVar68) - fVar95) * fVar107;
            fVar104 = ((*(float *)(uVar17 + 0x110) * fVar36 + fVar67) - fVar92) * fVar104;
            fVar105 = ((*(float *)(uVar17 + 0x114) * fVar36 + fVar67) - fVar93) * fVar105;
            fVar106 = ((*(float *)(uVar17 + 0x118) * fVar36 + fVar67) - fVar94) * fVar106;
            fVar107 = ((*(float *)(uVar17 + 0x11c) * fVar36 + fVar67) - fVar95) * fVar107;
            auVar78._0_8_ =
                 CONCAT44(((*(float *)(uVar17 + 0xf4) * fVar36 + fVar68) - fVar97) * fVar57,
                          ((*(float *)(uVar17 + 0xf0) * fVar36 + fVar68) - fVar96) * fVar50);
            auVar78._8_4_ = ((*(float *)(uVar17 + 0xf8) * fVar36 + fVar68) - fVar98) * fVar58;
            auVar78._12_4_ = ((*(float *)(uVar17 + 0xfc) * fVar36 + fVar68) - fVar99) * fVar59;
            auVar69._0_8_ =
                 CONCAT44(((fVar68 + *(float *)(uVar17 + 0x104) * fVar36) - fVar101) * fVar82,
                          ((fVar68 + *(float *)(uVar17 + 0x100) * fVar36) - fVar100) * fVar81);
            auVar69._8_4_ = ((fVar68 + *(float *)(uVar17 + 0x108) * fVar36) - fVar102) * fVar90;
            auVar69._12_4_ = ((fVar68 + *(float *)(uVar17 + 0x10c) * fVar36) - fVar103) * fVar91;
            auVar89._0_4_ = ((*(float *)(uVar17 + 0x120) * fVar36 + fVar67) - fVar96) * fVar50;
            auVar89._4_4_ = ((*(float *)(uVar17 + 0x124) * fVar36 + fVar67) - fVar97) * fVar57;
            auVar89._8_4_ = ((*(float *)(uVar17 + 0x128) * fVar36 + fVar67) - fVar98) * fVar58;
            auVar89._12_4_ = ((*(float *)(uVar17 + 300) * fVar36 + fVar67) - fVar99) * fVar59;
            auVar33._0_4_ = ((fVar36 * *(float *)(uVar17 + 0x130) + fVar67) - fVar100) * fVar81;
            auVar33._4_4_ = ((fVar36 * *(float *)(uVar17 + 0x134) + fVar67) - fVar101) * fVar82;
            auVar33._8_4_ = ((fVar36 * *(float *)(uVar17 + 0x138) + fVar67) - fVar102) * fVar90;
            auVar33._12_4_ = ((fVar36 * *(float *)(uVar17 + 0x13c) + fVar67) - fVar103) * fVar91;
            auVar42._8_4_ = auVar78._8_4_;
            auVar42._0_8_ = auVar78._0_8_;
            auVar42._12_4_ = auVar78._12_4_;
            auVar61 = minps(auVar42,auVar89);
            auVar47._8_4_ = auVar69._8_4_;
            auVar47._0_8_ = auVar69._0_8_;
            auVar47._12_4_ = auVar69._12_4_;
            auVar52 = minps(auVar47,auVar33);
            auVar52 = maxps(auVar61,auVar52);
            auVar48._8_4_ = auVar85._8_4_;
            auVar48._0_8_ = auVar85._0_8_;
            auVar48._12_4_ = auVar85._12_4_;
            auVar11._4_4_ = fVar105;
            auVar11._0_4_ = fVar104;
            auVar11._8_4_ = fVar106;
            auVar11._12_4_ = fVar107;
            auVar61 = minps(auVar48,auVar11);
            auVar12._4_4_ = fVar105;
            auVar12._0_4_ = fVar104;
            auVar12._8_4_ = fVar106;
            auVar12._12_4_ = fVar107;
            auVar86 = maxps(auVar85,auVar12);
            auVar79 = maxps(auVar78,auVar89);
            auVar54 = maxps(auVar69,auVar33);
            auVar54 = minps(auVar79,auVar54);
            auVar61 = maxps(auVar88,auVar61);
            auVar61 = maxps(auVar61,auVar52);
            auVar52 = minps(auVar15,auVar86);
            auVar52 = minps(auVar52,auVar54);
            auVar34._4_4_ = -(uint)(auVar61._4_4_ * 0.99999964 <= auVar52._4_4_ * 1.0000004);
            auVar34._0_4_ = -(uint)(auVar61._0_4_ * 0.99999964 <= auVar52._0_4_ * 1.0000004);
            auVar34._8_4_ = -(uint)(auVar61._8_4_ * 0.99999964 <= auVar52._8_4_ * 1.0000004);
            auVar34._12_4_ = -(uint)(auVar61._12_4_ * 0.99999964 <= auVar52._12_4_ * 1.0000004);
            uVar28 = movmskps((int)unaff_R15,auVar34);
            unaff_R15 = CONCAT44(uVar29,uVar28);
          }
          else {
            pfVar3 = (float *)(uVar17 + 0x80 + uVar25);
            pfVar1 = (float *)(uVar17 + 0x20 + uVar25);
            pfVar4 = (float *)(uVar17 + 0x80 + uVar26);
            pfVar2 = (float *)(uVar17 + 0x20 + uVar26);
            auVar43._0_4_ = ((*pfVar3 * fVar36 + *pfVar1) - fVar37) * fVar74;
            auVar43._4_4_ = ((pfVar3[1] * fVar36 + pfVar1[1]) - fVar37) * fVar74;
            auVar43._8_4_ = ((pfVar3[2] * fVar36 + pfVar1[2]) - fVar37) * fVar74;
            auVar43._12_4_ = ((pfVar3[3] * fVar36 + pfVar1[3]) - fVar37) * fVar74;
            auVar51._0_4_ = ((*pfVar4 * fVar36 + *pfVar2) - fVar49) * fVar84;
            auVar51._4_4_ = ((pfVar4[1] * fVar36 + pfVar2[1]) - fVar49) * fVar84;
            auVar51._8_4_ = ((pfVar4[2] * fVar36 + pfVar2[2]) - fVar49) * fVar84;
            auVar51._12_4_ = ((pfVar4[3] * fVar36 + pfVar2[3]) - fVar49) * fVar84;
            pfVar2 = (float *)(uVar17 + 0x80 + uVar27);
            pfVar1 = (float *)(uVar17 + 0x20 + uVar27);
            auVar38._0_4_ = ((*pfVar2 * fVar36 + *pfVar1) - fVar83) * fVar80;
            auVar38._4_4_ = ((pfVar2[1] * fVar36 + pfVar1[1]) - fVar83) * fVar80;
            auVar38._8_4_ = ((pfVar2[2] * fVar36 + pfVar1[2]) - fVar83) * fVar80;
            auVar38._12_4_ = ((pfVar2[3] * fVar36 + pfVar1[3]) - fVar83) * fVar80;
            auVar52 = maxps(auVar51,auVar38);
            auVar61 = maxps(auVar88,auVar43);
            pfVar2 = (float *)(uVar17 + 0x80 + (uVar25 ^ 0x10));
            pfVar1 = (float *)(uVar17 + 0x20 + (uVar25 ^ 0x10));
            auVar61 = maxps(auVar61,auVar52);
            auVar62._0_4_ = ((*pfVar2 * fVar36 + *pfVar1) - fVar37) * fVar35;
            auVar62._4_4_ = ((pfVar2[1] * fVar36 + pfVar1[1]) - fVar37) * fVar35;
            auVar62._8_4_ = ((pfVar2[2] * fVar36 + pfVar1[2]) - fVar37) * fVar35;
            auVar62._12_4_ = ((pfVar2[3] * fVar36 + pfVar1[3]) - fVar37) * fVar35;
            pfVar3 = (float *)(uVar17 + 0x80 + (uVar26 ^ 0x10));
            pfVar1 = (float *)(uVar17 + 0x20 + (uVar26 ^ 0x10));
            pfVar4 = (float *)(uVar17 + 0x80 + (uVar27 ^ 0x10));
            pfVar2 = (float *)(uVar17 + 0x20 + (uVar27 ^ 0x10));
            auVar53._0_4_ = ((*pfVar3 * fVar36 + *pfVar1) - fVar49) * fVar71;
            auVar53._4_4_ = ((pfVar3[1] * fVar36 + pfVar1[1]) - fVar49) * fVar71;
            auVar53._8_4_ = ((pfVar3[2] * fVar36 + pfVar1[2]) - fVar49) * fVar71;
            auVar53._12_4_ = ((pfVar3[3] * fVar36 + pfVar1[3]) - fVar49) * fVar71;
            auVar44._0_4_ = ((*pfVar4 * fVar36 + *pfVar2) - fVar83) * fVar73;
            auVar44._4_4_ = ((pfVar4[1] * fVar36 + pfVar2[1]) - fVar83) * fVar73;
            auVar44._8_4_ = ((pfVar4[2] * fVar36 + pfVar2[2]) - fVar83) * fVar73;
            auVar44._12_4_ = ((pfVar4[3] * fVar36 + pfVar2[3]) - fVar83) * fVar73;
            auVar54 = minps(auVar53,auVar44);
            auVar45._4_4_ = fVar5;
            auVar45._0_4_ = fVar5;
            auVar45._8_4_ = fVar5;
            auVar45._12_4_ = fVar5;
            auVar52 = minps(auVar45,auVar62);
            auVar52 = minps(auVar52,auVar54);
            bVar7 = auVar61._0_4_ <= auVar52._0_4_;
            bVar8 = auVar61._4_4_ <= auVar52._4_4_;
            bVar9 = auVar61._8_4_ <= auVar52._8_4_;
            bVar10 = auVar61._12_4_ <= auVar52._12_4_;
            if (uVar20 == 6) {
              bVar7 = (fVar36 < *(float *)(uVar17 + 0xf0) && *(float *)(uVar17 + 0xe0) <= fVar36) &&
                      bVar7;
              bVar8 = (fVar36 < *(float *)(uVar17 + 0xf4) && *(float *)(uVar17 + 0xe4) <= fVar36) &&
                      bVar8;
              bVar9 = (fVar36 < *(float *)(uVar17 + 0xf8) && *(float *)(uVar17 + 0xe8) <= fVar36) &&
                      bVar9;
              bVar10 = (fVar36 < *(float *)(uVar17 + 0xfc) && *(float *)(uVar17 + 0xec) <= fVar36)
                       && bVar10;
            }
            auVar39._0_4_ = (uint)bVar7 * -0x80000000;
            auVar39._4_4_ = (uint)bVar8 * -0x80000000;
            auVar39._8_4_ = (uint)bVar9 * -0x80000000;
            auVar39._12_4_ = (uint)bVar10 * -0x80000000;
            uVar28 = movmskps((int)unaff_R15,auVar39);
            unaff_R15 = CONCAT44(uVar29,uVar28);
          }
        }
        if ((uVar19 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar21 = 4;
          }
          else {
            uVar17 = uVar19 & 0xfffffffffffffff0;
            lVar23 = 0;
            if (unaff_R15 != 0) {
              for (; (unaff_R15 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            iVar21 = 0;
            uVar19 = *(ulong *)(uVar17 + lVar23 * 8);
            uVar22 = unaff_R15 - 1 & unaff_R15;
            if (uVar22 != 0) {
              pNVar24->ptr = uVar19;
              lVar23 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                }
              }
              uVar18 = uVar22 - 1;
              while( true ) {
                pNVar24 = pNVar24 + 1;
                uVar19 = *(ulong *)(uVar17 + lVar23 * 8);
                uVar18 = uVar18 & uVar22;
                if (uVar18 == 0) break;
                pNVar24->ptr = uVar19;
                lVar23 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                  }
                }
                uVar22 = uVar18 - 1;
              }
            }
          }
        }
        else {
          iVar21 = 6;
        }
      } while (iVar21 == 0);
      if (iVar21 == 6) {
        cVar16 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar19 & 0xfffffffffffffff0) * 0x40 + 8))
                           (&pre,ray,context);
        iVar21 = 0;
        if (cVar16 != '\0') {
          ray->tfar = -INFINITY;
          iVar21 = 3;
        }
      }
    } while (iVar21 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }